

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O1

void dsfmt_fill_array_close1_open2(dsfmt_t *dsfmt,double *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  
  if ((size & 1U) != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x1f8,"void dsfmt_fill_array_close1_open2(dsfmt_t *, double *, int)");
  }
  if (size < 0x17e) {
    __assert_fail("size >= DSFMT_N64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x1f9,"void dsfmt_fill_array_close1_open2(dsfmt_t *, double *, int)");
  }
  uVar6 = *(ulong *)((long)dsfmt->status + 0xbf8);
  uVar8 = (uVar6 << 0x20 | uVar6 >> 0x20) ^ dsfmt->status[0].u[0] << 0x13 ^ dsfmt->status[0x75].u[0]
  ;
  uVar6 = dsfmt->status[0].u[1];
  uVar7 = (dsfmt->status[0xbf].u[0] << 0x20 | dsfmt->status[0xbf].u[0] >> 0x20) ^ uVar6 << 0x13 ^
          *(ulong *)((long)dsfmt->status + 0x758);
  *array = (double)(uVar8 & 0xffafffffffb3f ^ uVar8 >> 0xc ^ dsfmt->status[0].u[0]);
  array[1] = (double)(uVar7 & 0xffdfffc90fffd ^ uVar7 >> 0xc ^ uVar6);
  lVar12 = 0;
  do {
    uVar6 = *(ulong *)((long)dsfmt->status + lVar12 + 0x10);
    uVar10 = *(ulong *)((long)dsfmt->status + lVar12 + 0x18);
    uVar9 = (uVar7 << 0x20 | uVar7 >> 0x20) ^ uVar6 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar12 + 0x760);
    uVar7 = (uVar8 << 0x20 | uVar8 >> 0x20) ^ uVar10 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar12 + 0x768);
    *(ulong *)((long)array + lVar12 + 0x10) = uVar9 & 0xffafffffffb3f ^ uVar9 >> 0xc ^ uVar6;
    *(ulong *)((long)array + lVar12 + 0x18) = uVar7 & 0xffdfffc90fffd ^ uVar7 >> 0xc ^ uVar10;
    lVar12 = lVar12 + 0x10;
    uVar8 = uVar9;
  } while (lVar12 != 0x490);
  lVar12 = 0;
  do {
    uVar6 = *(ulong *)((long)dsfmt->status + lVar12 + 0x4a0);
    uVar8 = *(ulong *)((long)dsfmt->status + lVar12 + 0x4a8);
    uVar10 = (uVar7 << 0x20 | uVar7 >> 0x20) ^ uVar6 << 0x13 ^ *(ulong *)((long)array + lVar12);
    uVar7 = (uVar9 << 0x20 | uVar9 >> 0x20) ^ uVar8 << 0x13 ^ *(ulong *)((long)array + lVar12 + 8);
    *(ulong *)((long)array + lVar12 + 0x4a0) = uVar10 & 0xffafffffffb3f ^ uVar10 >> 0xc ^ uVar6;
    *(ulong *)((long)array + lVar12 + 0x4a8) = uVar7 & 0xffdfffc90fffd ^ uVar7 >> 0xc ^ uVar8;
    lVar12 = lVar12 + 0x10;
    uVar9 = uVar10;
  } while (lVar12 != 0x750);
  uVar11 = (uint)size >> 1;
  uVar6 = 0xbf;
  if (0x2fc < (uint)size) {
    pdVar14 = array + 0x17f;
    uVar6 = 0xbf;
    uVar8 = uVar10;
    do {
      uVar10 = (uVar7 << 0x20 | uVar7 >> 0x20) ^ (long)pdVar14[-0x17f] << 0x13 ^
               (ulong)pdVar14[-0x95];
      uVar7 = (uVar8 << 0x20 | uVar8 >> 0x20) ^ (long)pdVar14[-0x17e] << 0x13 ^
              (ulong)pdVar14[-0x94];
      pdVar14[-1] = (double)(uVar10 & 0xffafffffffb3f ^ uVar10 >> 0xc ^ (ulong)pdVar14[-0x17f]);
      *pdVar14 = (double)(uVar7 & 0xffdfffc90fffd ^ uVar7 >> 0xc ^ (ulong)pdVar14[-0x17e]);
      uVar6 = uVar6 + 1;
      pdVar14 = pdVar14 + 2;
      uVar8 = uVar10;
    } while (uVar11 - 0xbf != uVar6);
  }
  if ((uint)size < 0x2fc) {
    uVar9 = 1;
    if (1 < (int)(0x17e - uVar11)) {
      uVar9 = (ulong)(0x17e - uVar11);
    }
    lVar12 = -0xbf0;
    uVar8 = 0;
    do {
      puVar1 = (undefined8 *)((long)array + lVar12 + (ulong)uVar11 * 0x10);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)dsfmt->status + lVar12 + 0xbf0);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      uVar8 = uVar8 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar9 != uVar8);
  }
  else {
    uVar8 = 0;
  }
  if ((int)uVar6 < (int)uVar11) {
    uVar6 = uVar6 & 0xffffffff;
    lVar13 = uVar11 - uVar6;
    lVar12 = 0;
    uVar9 = uVar10;
    do {
      uVar3 = *(ulong *)((long)array + lVar12 + uVar6 * 0x10 + -0xbf0);
      uVar4 = *(ulong *)((long)array + lVar12 + uVar6 * 0x10 + -0xbe8);
      uVar10 = (uVar7 << 0x20 | uVar7 >> 0x20) ^ uVar3 << 0x13 ^
               *(ulong *)((long)array + lVar12 + uVar6 * 0x10 + -0x4a0);
      uVar7 = (uVar9 << 0x20 | uVar9 >> 0x20) ^ uVar4 << 0x13 ^
              *(ulong *)((long)array + lVar12 + uVar6 * 0x10 + -0x498);
      *(ulong *)((long)array + lVar12 + uVar6 * 0x10) =
           uVar10 & 0xffafffffffb3f ^ uVar10 >> 0xc ^ uVar3;
      *(ulong *)((long)array + lVar12 + uVar6 * 0x10 + 8) =
           uVar7 & 0xffdfffc90fffd ^ uVar7 >> 0xc ^ uVar4;
      puVar1 = (undefined8 *)((long)array + lVar12 + uVar6 * 0x10);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)dsfmt->status + lVar12 + uVar8 * 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar12 = lVar12 + 0x10;
      lVar13 = lVar13 + -1;
      uVar9 = uVar10;
    } while (lVar13 != 0);
  }
  dsfmt->status[0xbf].u[0] = uVar10;
  *(ulong *)((long)dsfmt->status + 0xbf8) = uVar7;
  return;
}

Assistant:

void dsfmt_fill_array_close1_open2(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_c1o2(dsfmt, (w128_t *)array, size / 2);
}